

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O1

optional<cmWindowsRegistry::View> cmWindowsRegistry::ToView(string_view name)

{
  int iVar1;
  iterator iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  key_type local_c0;
  undefined8 local_b0;
  char *local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  char *local_90;
  undefined4 local_88;
  undefined8 local_80;
  char *local_78;
  undefined4 local_70;
  undefined8 local_68;
  char *local_60;
  undefined4 local_58;
  undefined8 local_50;
  char *local_48;
  undefined4 local_40;
  undefined8 local_38;
  char *local_30;
  undefined4 local_28;
  undefined8 local_20;
  char *local_18;
  undefined4 local_10;
  
  if (ToView(std::basic_string_view<char,std::char_traits<char>>)::ViewDefinitions == '\0') {
    iVar1 = __cxa_guard_acquire(&ToView(std::basic_string_view<char,std::char_traits<char>>)::
                                 ViewDefinitions);
    if (iVar1 != 0) {
      local_b0 = 4;
      local_a8 = "BOTH";
      local_a0 = 0;
      local_98 = 4;
      local_90 = "HOST";
      local_88 = 2;
      local_80 = 6;
      local_78 = "TARGET";
      local_70 = 1;
      local_68 = 2;
      local_60 = "32";
      local_58 = 5;
      local_50 = 2;
      local_48 = "64";
      local_40 = 6;
      local_38 = 5;
      local_30 = "32_64";
      local_28 = 4;
      local_20 = 5;
      local_18 = "64_32";
      local_10 = 3;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,cmWindowsRegistry::View>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,cmWindowsRegistry::View>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _Hashtable<std::pair<std::basic_string_view<char,std::char_traits<char>>const,cmWindowsRegistry::View>const*>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,cmWindowsRegistry::View>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,cmWindowsRegistry::View>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&ToView::ViewDefinitions,&local_b0,&stack0xfffffffffffffff8,0,&local_c1,
                 &local_c2,&local_c3);
      __cxa_atexit(std::
                   unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>_>
                   ::~unordered_map,&ToView::ViewDefinitions,&__dso_handle);
      __cxa_guard_release(&ToView(std::basic_string_view<char,std::char_traits<char>>)::
                           ViewDefinitions);
    }
  }
  iVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&ToView::ViewDefinitions._M_h,&local_c0);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar3 = (ulong)*(uint *)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
                                   ._M_cur + 0x18);
    uVar4 = 0x100000000;
  }
  return (optional<cmWindowsRegistry::View>)(uVar3 | uVar4);
}

Assistant:

cm::optional<cmWindowsRegistry::View> cmWindowsRegistry::ToView(
  cm::string_view name)
{
  static std::unordered_map<cm::string_view, cmWindowsRegistry::View>
    ViewDefinitions{
      { "BOTH"_s, View::Both },     { "HOST"_s, View::Host },
      { "TARGET"_s, View::Target }, { "32"_s, View::Reg32 },
      { "64"_s, View::Reg64 },      { "32_64"_s, View::Reg32_64 },
      { "64_32"_s, View::Reg64_32 }
    };

  auto it = ViewDefinitions.find(name);

  return it == ViewDefinitions.end()
    ? cm::nullopt
    : cm::optional<cmWindowsRegistry::View>{ it->second };
}